

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall cs222::Parser::parseMemory(Parser *this,string *token,Operand *operand)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  Parser *pPVar6;
  string location;
  string indexedX;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Type local_34;
  
  bVar2 = parseLocation(this,token,operand);
  bVar5 = true;
  if (bVar2) {
    return true;
  }
  cVar1 = *(token->_M_dataplus)._M_p;
  if ((cVar1 == '@') || (cVar1 == '#')) {
    pPVar6 = (Parser *)local_80;
    std::__cxx11::string::substr((ulong)local_80,(ulong)token);
    bVar2 = parseLocation(pPVar6,(string *)local_80,operand);
    if ((undefined1 *)CONCAT44(local_80._4_4_,local_80._0_4_) != local_70) {
      operator_delete((undefined1 *)CONCAT44(local_80._4_4_,local_80._0_4_),
                      (ulong)(local_70._0_8_ + 1));
    }
    if (bVar2) {
      if (cVar1 == '#') {
        *(byte *)&(this->flags).super__Base_bitset<1UL>._M_w =
             (byte)(this->flags).super__Base_bitset<1UL>._M_w | 0x10;
        return true;
      }
      if (cVar1 != '@') {
        return true;
      }
      *(byte *)&(this->flags).super__Base_bitset<1UL>._M_w =
           (byte)(this->flags).super__Base_bitset<1UL>._M_w | 0x20;
      return true;
    }
LAB_001187c5:
    bVar5 = false;
  }
  else {
    lVar4 = std::__cxx11::string::find((char)token,0x2c);
    if (lVar4 == -1) {
LAB_00118726:
      pPVar6 = this;
      bVar2 = parseLiteral(this,token,operand);
      if (bVar2) {
        return true;
      }
      bVar2 = parseConstant(pPVar6,token,operand);
      if (bVar2) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)token);
      if (iVar3 == 0) {
        local_34 = LOCCTR;
        local_58._M_allocated_capacity = (size_type)&local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        Operand::Operand((Operand *)local_80,&local_34,(string *)&local_58);
        operand->type = local_80._0_4_;
        std::__cxx11::string::operator=((string *)&operand->value,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_70 + 8)) {
          operator_delete(local_78._M_p,(ulong)(local_70._8_8_ + 1));
        }
        local_70._0_8_ = local_48._M_allocated_capacity;
        local_78._M_p = (pointer)local_58._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity == &local_48) {
          return true;
        }
      }
      else {
        bVar2 = parseExpression(this,token);
        if (!bVar2) goto LAB_001187c5;
        local_58._M_allocated_capacity._0_4_ = 8;
        Operand::Operand((Operand *)local_80,(Type *)&local_58._M_allocated_capacity,token);
        operand->type = local_80._0_4_;
        std::__cxx11::string::operator=((string *)&operand->value,(string *)&local_78);
        local_70._0_8_ = local_70._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_70 + 8)) {
          return true;
        }
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_80,(ulong)token);
      this_00 = &local_58;
      std::__cxx11::string::substr((ulong)this_00,(ulong)token);
      bVar2 = parseLocation((Parser *)this_00,(string *)local_80,operand);
      if ((!bVar2) || (iVar3 = std::__cxx11::string::compare(local_58._M_local_buf), iVar3 != 0)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity != &local_48) {
          operator_delete((void *)local_58._M_allocated_capacity,
                          (ulong)(local_48._M_allocated_capacity + 1));
        }
        if ((undefined1 *)CONCAT44(local_80._4_4_,local_80._0_4_) != local_70) {
          operator_delete((undefined1 *)CONCAT44(local_80._4_4_,local_80._0_4_),
                          (ulong)(local_70._0_8_ + 1));
        }
        goto LAB_00118726;
      }
      *(byte *)&(this->flags).super__Base_bitset<1UL>._M_w =
           (byte)(this->flags).super__Base_bitset<1UL>._M_w | 8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_allocated_capacity != &local_48) {
        operator_delete((void *)local_58._M_allocated_capacity,
                        (ulong)(local_48._M_allocated_capacity + 1));
      }
      local_78._M_p = (pointer)CONCAT44(local_80._4_4_,local_80._0_4_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_80._4_4_,local_80._0_4_) ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70) {
        return true;
      }
    }
    operator_delete(local_78._M_p,(ulong)(local_70._0_8_ + 1));
  }
  return bVar5;
}

Assistant:

bool Parser::parseMemory(const std::string& token, Operand& operand)
    {
        if (parseLocation(token, operand))
        {
            return true;
        }

        const char prefix = token[0];
        if (prefix == '@' || prefix == '#')
        {
            if (!parseLocation(token.substr(1), operand))
            {
                return false;
            }
            switch (prefix)
            {
                case '@':
                    flags.set(Instruction::FLAG_INDIRECT);
                    break;
                case '#':
                    flags.set(Instruction::FLAG_IMMEDIATE);
                    break;
            }
            return true;
        }

        size_t commaPosition = token.find(',');
        if (commaPosition != std::string::npos)
        {
            std::string location = token.substr(0, commaPosition);
            std::string indexedX = token.substr(commaPosition + 1);
            if (parseLocation(location, operand) && indexedX == "X")
            {
                flags.set(Instruction::FLAG_INDEXED);
                return true;
            }
        }

        if (parseLiteral(token, operand) || parseConstant(token, operand))
        {
            return true;
        }

        if (token == "*")
        {
            operand = Operand(Operand::LOCCTR);
            return true;
        }

        if (parseExpression(token))
        {
            operand = Operand(Operand::EXPRESSION, token);
            return true;
        }

        return false;
    }